

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_gnu_index.c
# Opt level: O0

void dwarf_gnu_index_dealloc(Dwarf_Gnu_Index_Head head)

{
  Dwarf_Debug dbg_00;
  Dwarf_Debug dbg;
  Dwarf_Gnu_Index_Head head_local;
  
  if (((head != (Dwarf_Gnu_Index_Head)0x0) && (dbg_00 = head->gi_dbg, dbg_00 != (Dwarf_Debug)0x0))
     && (dbg_00->de_magic == 0xebfdebfd)) {
    _dwarf_free_gnu_index_head_content(head);
    dwarf_dealloc(dbg_00,head,0x35);
  }
  return;
}

Assistant:

void
dwarf_gnu_index_dealloc(Dwarf_Gnu_Index_Head head)
{
    Dwarf_Debug dbg = 0;
    if (!head) {
        return;
    }
    dbg = head->gi_dbg;
    if (IS_INVALID_DBG(dbg)) {
        return;
    }
    _dwarf_free_gnu_index_head_content(head);
    dwarf_dealloc(dbg,head,DW_DLA_GNU_INDEX_HEAD);
}